

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_backend.h
# Opt level: O2

void __thiscall basisu::basisu_backend::clear(basisu_backend *this)

{
  *(undefined8 *)((long)&(this->m_params).m_selector_rdo_quality_thresh + 1) = 0;
  (this->m_params).m_endpoint_rdo_quality_thresh = 0.0;
  (this->m_params).m_selector_rdo_quality_thresh = 0.0;
  this->m_pFront_end = (basisu_frontend *)0x0;
  *(undefined4 *)((long)&this->m_pFront_end + 7) = 0;
  (this->m_params).m_validate = true;
  basisu_backend_output::clear(&this->m_output);
  return;
}

Assistant:

void clear()
		{
			m_etc1s = false;
			m_debug = false;
			m_debug_images = false;
			m_endpoint_rdo_quality_thresh = 0.0f;
			m_selector_rdo_quality_thresh = 0.0f;
			m_compression_level = 0;
			m_used_global_codebooks = false;
			m_validate = true;
		}